

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<PartialJointPolicyDiscretePure> * __thiscall
boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=
          (shared_ptr<PartialJointPolicyDiscretePure> *this,
          shared_ptr<PartialJointPolicyPureVector> *r)

{
  undefined8 in_RSI;
  shared_ptr<PartialJointPolicyDiscretePure> *in_RDI;
  shared_ptr<PartialJointPolicyDiscretePure> *in_stack_ffffffffffffffc8;
  shared_ptr<PartialJointPolicyDiscretePure> local_20 [2];
  
  shared_ptr<PartialJointPolicyPureVector>(local_20,in_RSI);
  swap(in_RDI,in_stack_ffffffffffffffc8);
  ~shared_ptr((shared_ptr<PartialJointPolicyDiscretePure> *)0x96f030);
  return in_RDI;
}

Assistant:

shared_ptr & operator=(shared_ptr<Y> const & r) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }